

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O1

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  uint _h;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  undefined4 *puVar14;
  int iVar15;
  ulong uVar16;
  undefined4 *puVar17;
  undefined4 *puVar18;
  ulong uVar19;
  int _w;
  undefined4 *puVar20;
  ulong local_90;
  ulong local_80;
  undefined4 *local_78;
  undefined4 *local_60;
  
  uVar1 = bottom_blob->c;
  iVar10 = this->stride;
  uVar9 = (long)bottom_blob->w / (long)iVar10;
  _h = bottom_blob->h / iVar10;
  _w = (int)uVar9;
  Mat::create(top_blob,_w,_h,uVar1 * iVar10 * iVar10,bottom_blob->elemsize,opt->blob_allocator);
  iVar10 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)uVar1) {
      local_60 = (undefined4 *)bottom_blob->data;
      sVar4 = bottom_blob->elemsize;
      uVar2 = this->stride;
      lVar11 = (long)bottom_blob->w * sVar4;
      sVar5 = bottom_blob->cstep;
      local_90 = 0;
      do {
        if (0 < (int)uVar2) {
          iVar10 = this->mode;
          local_78 = local_60;
          local_80 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar6 = top_blob->data;
              sVar7 = top_blob->cstep;
              sVar8 = top_blob->elemsize;
              iVar3 = this->stride;
              uVar19 = 0;
              puVar20 = local_78;
              do {
                if (0 < (int)_h) {
                  iVar15 = (uVar2 * (int)local_80 + (int)uVar19) * uVar1 + (int)local_90;
                  if (iVar10 == 0) {
                    iVar15 = (uVar2 * (int)local_90 + (int)local_80) * uVar2 + (int)uVar19;
                  }
                  puVar18 = (undefined4 *)((long)iVar15 * sVar7 * sVar8 + (long)pvVar6);
                  uVar16 = 0;
                  puVar14 = puVar20;
                  do {
                    uVar13 = uVar9 & 0xffffffff;
                    puVar17 = puVar14;
                    if (0 < _w) {
                      do {
                        *puVar18 = *puVar17;
                        puVar18 = puVar18 + 1;
                        puVar17 = puVar17 + iVar3;
                        uVar12 = (int)uVar13 - 1;
                        uVar13 = (ulong)uVar12;
                      } while (uVar12 != 0);
                    }
                    uVar16 = uVar16 + 1;
                    puVar14 = (undefined4 *)((long)puVar14 + lVar11 * iVar3);
                  } while (uVar16 != _h);
                }
                uVar19 = uVar19 + 1;
                puVar20 = puVar20 + 1;
              } while (uVar19 != uVar2);
            }
            local_80 = local_80 + 1;
            local_78 = (undefined4 *)((long)local_78 + lVar11);
          } while (local_80 != uVar2);
        }
        local_90 = local_90 + 1;
        local_60 = (undefined4 *)((long)local_60 + sVar4 * sVar5);
      } while (local_90 != uVar1);
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                int p;
                if (mode == 0)
                    p = q * stride * stride + sh * stride + sw;
                else // if (mode == 1)
                    p = (sh * stride + sw) * channels + q;

                float* outptr = top_blob.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i * stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}